

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::detail::MultipartFormDataParser::parse
          (MultipartFormDataParser *this,char *buf,size_t n,ContentReceiver *content_callback,
          MultipartContentHeader *header_callback)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  const_reference pvVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  unsigned_long __args_1;
  ulong uVar9;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern_3;
  size_t pos_2;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern_2;
  size_t pos_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern_1;
  string_type local_140;
  undefined1 local_120 [8];
  smatch m;
  string local_e0;
  undefined1 local_c0 [8];
  string header;
  ulong local_98;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern;
  MultipartContentHeader *header_callback_local;
  ContentReceiver *content_callback_local;
  size_t n_local;
  char *buf_local;
  MultipartFormDataParser *this_local;
  
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::re_content_disposition_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::re_content_disposition_abi_cxx11_,
               "^Content-Disposition:\\s*form-data;\\s*name=\"(.*?)\"(?:;\\s*filename=\"(.*?)\")?(?:;\\s*filename\\*=\\S+)?\\s*$"
               ,1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::re_content_disposition_abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::dash__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::dash__abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::dash__abi_cxx11_,"--",(allocator<char> *)(pattern.field_2._M_local_buf + 0xb));
    std::allocator<char>::~allocator((allocator<char> *)(pattern.field_2._M_local_buf + 0xb));
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::dash__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::dash__abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::crlf__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::crlf__abi_cxx11_,"\r\n",(allocator<char> *)(pattern.field_2._M_local_buf + 10));
    std::allocator<char>::~allocator((allocator<char> *)(pattern.field_2._M_local_buf + 10));
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::crlf__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::crlf__abi_cxx11_);
  }
  buf_append(this,buf,n);
  do {
    sVar4 = buf_size(this);
    if (sVar4 == 0) {
      this_local._7_1_ = 1;
      goto LAB_001ad35f;
    }
    switch(this->state_) {
    case 0:
      std::operator+(&local_88,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_,&this->boundary_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     &local_88,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_88);
      uVar9 = std::__cxx11::string::size();
      sVar4 = buf_size(this);
      if (sVar4 < uVar9) {
        this_local._7_1_ = 1;
        pos._4_4_ = 1;
      }
      else {
        bVar2 = buf_start_with(this,(string *)local_68);
        if (bVar2) {
          sVar4 = std::__cxx11::string::size();
          buf_erase(this,sVar4);
          this->state_ = 1;
          pos._4_4_ = 4;
        }
        else {
          this_local._7_1_ = 0;
          pos._4_4_ = 1;
        }
      }
      std::__cxx11::string::~string((string *)local_68);
      if (pos._4_4_ == 1) goto LAB_001ad35f;
      break;
    case 1:
      clear_file_info(this);
      this->state_ = 2;
      break;
    case 2:
      local_98 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                ::crlf__abi_cxx11_);
      if (0x2000 < local_98) {
        this_local._7_1_ = 0;
        goto LAB_001ad35f;
      }
      while (sVar4 = buf_size(this), local_98 < sVar4) {
        if (local_98 == 0) {
          bVar2 = std::function<bool_(const_httplib::MultipartFormData_&)>::operator()
                            (header_callback,&this->file_);
          if (!bVar2) {
            this->is_valid_ = false;
            this_local._7_1_ = 0;
            goto LAB_001ad35f;
          }
          sVar4 = std::__cxx11::string::size();
          buf_erase(this,sVar4);
          this->state_ = 3;
          break;
        }
        if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
             ::header_name_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                         ::header_name_abi_cxx11_), iVar3 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::header_name_abi_cxx11_,"content-type:",
                     (allocator<char> *)(header.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(header.field_2._M_local_buf + 0xf));
          __cxa_atexit(std::__cxx11::string::~string,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::header_name_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                               ::header_name_abi_cxx11_);
        }
        buf_head_abi_cxx11_((string *)local_c0,this,local_98);
        bVar2 = start_with_case_ignore
                          (this,(string *)local_c0,
                           &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                            ::header_name_abi_cxx11_);
        if (bVar2) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&m._M_begin,(ulong)local_c0);
          trim_copy(&local_e0,(string *)&m._M_begin);
          std::__cxx11::string::operator=((string *)&(this->file_).content_type,(string *)&local_e0)
          ;
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&m._M_begin);
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_120);
          bVar2 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c0,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)local_120,
                             &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                              ::re_content_disposition_abi_cxx11_,0);
          if (bVar2) {
            pvVar5 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_120,1);
            std::__cxx11::sub_match::operator_cast_to_string(&local_140,(sub_match *)pvVar5);
            std::__cxx11::string::operator=((string *)&this->file_,(string *)&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            pvVar5 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_120,2);
            std::__cxx11::sub_match::operator_cast_to_string
                      ((string_type *)((long)&pattern_1.field_2 + 8),(sub_match *)pvVar5);
            std::__cxx11::string::operator=
                      ((string *)&(this->file_).filename,
                       (string *)(pattern_1.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(pattern_1.field_2._M_local_buf + 8));
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_120);
        }
        lVar8 = std::__cxx11::string::size();
        buf_erase(this,local_98 + lVar8);
        local_98 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                  ::crlf__abi_cxx11_);
        std::__cxx11::string::~string((string *)local_c0);
      }
      if (this->state_ != 3) {
        this_local._7_1_ = 1;
        goto LAB_001ad35f;
      }
      break;
    case 3:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_1,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_);
      uVar9 = std::__cxx11::string::size();
      sVar4 = buf_size(this);
      if (sVar4 < uVar9) {
        this_local._7_1_ = 1;
        bVar2 = true;
      }
      else {
        pattern_2.field_2._8_8_ = buf_find(this,(string *)&pos_1);
        pcVar7 = buf_data(this);
        bVar2 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                          (content_callback,pcVar7,pattern_2.field_2._8_8_);
        if (bVar2) {
          buf_erase(this,pattern_2.field_2._8_8_);
          bVar2 = false;
        }
        else {
          this->is_valid_ = false;
          this_local._7_1_ = 0;
          bVar2 = true;
        }
      }
      std::__cxx11::string::~string((string *)&pos_1);
      if (bVar2) goto LAB_001ad35f;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_2,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos_2,
                     &this->boundary_);
      std::__cxx11::string::~string((string *)&pos_2);
      uVar9 = std::__cxx11::string::size();
      sVar4 = buf_size(this);
      if (sVar4 < uVar9) {
        this_local._7_1_ = 1;
        bVar2 = true;
      }
      else {
        sVar4 = buf_find(this,(string *)local_1a8);
        pattern_3.field_2._8_8_ = sVar4;
        sVar6 = buf_size(this);
        if (sVar4 < sVar6) {
          pcVar7 = buf_data(this);
          bVar2 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                            (content_callback,pcVar7,pattern_3.field_2._8_8_);
          uVar1 = pattern_3.field_2._8_8_;
          if (bVar2) {
            lVar8 = std::__cxx11::string::size();
            buf_erase(this,uVar1 + lVar8);
            this->state_ = 4;
LAB_001ad17d:
            bVar2 = false;
          }
          else {
            this->is_valid_ = false;
            this_local._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          pcVar7 = buf_data(this);
          __args_1 = std::__cxx11::string::size();
          bVar2 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                            (content_callback,pcVar7,__args_1);
          if (bVar2) {
            sVar4 = std::__cxx11::string::size();
            buf_erase(this,sVar4);
            goto LAB_001ad17d;
          }
          this->is_valid_ = false;
          this_local._7_1_ = 0;
          bVar2 = true;
        }
      }
      std::__cxx11::string::~string((string *)local_1a8);
      if (bVar2) goto LAB_001ad35f;
      break;
    case 4:
      uVar9 = std::__cxx11::string::size();
      sVar4 = buf_size(this);
      if (sVar4 < uVar9) {
        this_local._7_1_ = 1;
        goto LAB_001ad35f;
      }
      bVar2 = buf_start_with(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_);
      if (bVar2) {
        sVar4 = std::__cxx11::string::size();
        buf_erase(this,sVar4);
        this->state_ = 1;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::dash__abi_cxx11_,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::crlf__abi_cxx11_);
        uVar9 = std::__cxx11::string::size();
        sVar4 = buf_size(this);
        if (sVar4 < uVar9) {
          this_local._7_1_ = 1;
          bVar2 = true;
        }
        else {
          bVar2 = buf_start_with(this,(string *)local_1f0);
          if (bVar2) {
            sVar4 = std::__cxx11::string::size();
            buf_erase(this,sVar4);
            this->is_valid_ = true;
            this->state_ = 5;
            bVar2 = false;
          }
          else {
            this_local._7_1_ = 1;
            bVar2 = true;
          }
        }
        std::__cxx11::string::~string((string *)local_1f0);
        if (bVar2) goto LAB_001ad35f;
      }
      break;
    case 5:
      this->is_valid_ = false;
      this_local._7_1_ = 0;
LAB_001ad35f:
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool parse(const char *buf, size_t n, const ContentReceiver &content_callback,
             const MultipartContentHeader &header_callback) {

    // TODO: support 'filename*'
    static const std::regex re_content_disposition(
        R"~(^Content-Disposition:\s*form-data;\s*name="(.*?)"(?:;\s*filename="(.*?)")?(?:;\s*filename\*=\S+)?\s*$)~",
        std::regex_constants::icase);

    static const std::string dash_ = "--";
    static const std::string crlf_ = "\r\n";

    buf_append(buf, n);

    while (buf_size() > 0) {
      switch (state_) {
      case 0: { // Initial boundary
        auto pattern = dash_ + boundary_ + crlf_;
        if (pattern.size() > buf_size()) { return true; }
        if (!buf_start_with(pattern)) { return false; }
        buf_erase(pattern.size());
        state_ = 1;
        break;
      }
      case 1: { // New entry
        clear_file_info();
        state_ = 2;
        break;
      }
      case 2: { // Headers
        auto pos = buf_find(crlf_);
        if (pos > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }
        while (pos < buf_size()) {
          // Empty line
          if (pos == 0) {
            if (!header_callback(file_)) {
              is_valid_ = false;
              return false;
            }
            buf_erase(crlf_.size());
            state_ = 3;
            break;
          }

          static const std::string header_name = "content-type:";
          const auto header = buf_head(pos);
          if (start_with_case_ignore(header, header_name)) {
            file_.content_type = trim_copy(header.substr(header_name.size()));
          } else {
            std::smatch m;
            if (std::regex_match(header, m, re_content_disposition)) {
              file_.name = m[1];
              file_.filename = m[2];
            }
          }

          buf_erase(pos + crlf_.size());
          pos = buf_find(crlf_);
        }
        if (state_ != 3) { return true; }
        break;
      }
      case 3: { // Body
        {
          auto pattern = crlf_ + dash_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);

          if (!content_callback(buf_data(), pos)) {
            is_valid_ = false;
            return false;
          }

          buf_erase(pos);
        }
        {
          auto pattern = crlf_ + dash_ + boundary_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);
          if (pos < buf_size()) {
            if (!content_callback(buf_data(), pos)) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pos + pattern.size());
            state_ = 4;
          } else {
            if (!content_callback(buf_data(), pattern.size())) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pattern.size());
          }
        }
        break;
      }
      case 4: { // Boundary
        if (crlf_.size() > buf_size()) { return true; }
        if (buf_start_with(crlf_)) {
          buf_erase(crlf_.size());
          state_ = 1;
        } else {
          auto pattern = dash_ + crlf_;
          if (pattern.size() > buf_size()) { return true; }
          if (buf_start_with(pattern)) {
            buf_erase(pattern.size());
            is_valid_ = true;
            state_ = 5;
          } else {
            return true;
          }
        }
        break;
      }
      case 5: { // Done
        is_valid_ = false;
        return false;
      }
      }
    }

    return true;
  }